

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Reader * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcCallContext::getParams
          (Reader *__return_storage_ptr__,RpcCallContext *this)

{
  SegmentReader *pSVar1;
  CapTableReader *pCVar2;
  int iVar3;
  undefined4 uVar4;
  Fault f;
  DebugComparison<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_&,_const_kj::None_&>
  _kjCondition;
  
  _kjCondition.left = &this->request;
  _kjCondition.result = (this->request).ptr.ptr != (IncomingRpcMessage *)0x0;
  _kjCondition.right = (None *)&kj::none;
  _kjCondition.op.content.ptr = " != ";
  _kjCondition.op.content.size_ = 5;
  if (_kjCondition.result) {
    pSVar1 = (this->params).reader.segment;
    pCVar2 = (this->params).reader.capTable;
    iVar3 = (this->params).reader.nestingLimit;
    uVar4 = *(undefined4 *)&(this->params).reader.field_0x1c;
    (__return_storage_ptr__->reader).pointer = (this->params).reader.pointer;
    (__return_storage_ptr__->reader).nestingLimit = iVar3;
    *(undefined4 *)&(__return_storage_ptr__->reader).field_0x1c = uVar4;
    (__return_storage_ptr__->reader).segment = pSVar1;
    (__return_storage_ptr__->reader).capTable = pCVar2;
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,decltype(nullptr)>>&,kj::None_const&>&,char_const(&)[46]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
             ,0xcb3,FAILED,"request != kj::none",
             "_kjCondition,\"Can\'t call getParams() after releaseParams().\"",&_kjCondition,
             (char (*) [46])"Can\'t call getParams() after releaseParams().");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

AnyPointer::Reader getParams() override {
      KJ_REQUIRE(request != kj::none, "Can't call getParams() after releaseParams().");
      return params;
    }